

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O3

unzFile unzOpenInternal(void *path,zlib_filefunc64_32_def *pzlib_filefunc64_32_def,
                       int is64bitOpenFunction)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  voidpf pvVar9;
  ZPOS64_T ZVar10;
  ulong uVar11;
  void *pvVar12;
  uLong uVar13;
  long lVar14;
  char *pcVar15;
  unz64_s *s;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uLong uVar19;
  zlib_filefunc64_32_def *pzVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uLong uL;
  uLong number_disk;
  uLong number_disk_with_CD;
  ZPOS64_T uL64;
  uLong uS;
  ulong local_1c8;
  uLong local_1b0;
  ZPOS64_T local_1a8;
  uLong local_1a0;
  uLong local_198;
  ZPOS64_T local_190;
  uLong local_188;
  zlib_filefunc64_32_def local_180;
  int local_128;
  voidpf local_120;
  uLong local_118 [6];
  ulong local_e8;
  uLong local_e0;
  uLong local_d8 [19];
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  
  local_180.ztell32_file = (tell_file_func)0x0;
  local_180.zseek32_file = (seek_file_func)0x0;
  if (pzlib_filefunc64_32_def == (zlib_filefunc64_32_def *)0x0) {
    fill_fopen64_filefunc(&local_180.zfile_func64);
  }
  else {
    pzVar20 = &local_180;
    for (lVar14 = 0xb; lVar14 != 0; lVar14 = lVar14 + -1) {
      (pzVar20->zfile_func64).zopen64_file = (pzlib_filefunc64_32_def->zfile_func64).zopen64_file;
      pzlib_filefunc64_32_def =
           (zlib_filefunc64_32_def *)&(pzlib_filefunc64_32_def->zfile_func64).zread_file;
      pzVar20 = (zlib_filefunc64_32_def *)&(pzVar20->zfile_func64).zread_file;
    }
  }
  local_128 = is64bitOpenFunction;
  pvVar9 = call_zopen64(&local_180,path,5);
  if (pvVar9 != (voidpf)0x0) {
    local_120 = pvVar9;
    lVar14 = call_zseek64(&local_180,pvVar9,0,2);
    if (lVar14 == 0) {
      ZVar10 = call_ztell64(&local_180,pvVar9);
      uVar11 = 0xffff;
      if (ZVar10 < 0xffff) {
        uVar11 = ZVar10;
      }
      pvVar12 = malloc(0x404);
      if (pvVar12 != (void *)0x0) {
        if (4 < ZVar10) {
          uVar22 = 4;
          do {
            uVar16 = uVar22 + 0x400;
            uVar22 = uVar11;
            if (uVar16 < uVar11) {
              uVar22 = uVar16;
            }
            uVar19 = 0x404;
            if (uVar22 < 0x404) {
              uVar19 = uVar22;
            }
            lVar14 = call_zseek64(&local_180,pvVar9,ZVar10 - uVar22,0);
            if ((lVar14 != 0) ||
               (uVar13 = (*local_180.zfile_func64.zread_file)
                                   (local_180.zfile_func64.opaque,pvVar9,pvVar12,uVar19),
               uVar13 != uVar19)) break;
            uVar23 = (ulong)((int)uVar19 - 4);
            iVar5 = (int)uVar19 + -3;
            do {
              if ((((*(char *)((long)pvVar12 + uVar23) == 'P') &&
                   (*(char *)((long)pvVar12 + uVar23 + 1) == 'K')) &&
                  (*(char *)((long)pvVar12 + uVar23 + 2) == '\x06')) &&
                 (*(char *)((long)pvVar12 + uVar23 + 3) == '\a')) {
                if ((ZVar10 - uVar22) + uVar23 != 0) {
                  free(pvVar12);
                  if (ZVar10 < uVar16) {
                    uVar16 = ZVar10;
                  }
                  if (0xfffe < uVar16) {
                    uVar16 = 0xffff;
                  }
                  lVar14 = call_zseek64(&local_180,pvVar9,(ZVar10 - uVar16) + uVar23,0);
                  if (((((lVar14 != 0) ||
                        (iVar5 = unz64local_getLong(&local_180,pvVar9,&local_1b0), iVar5 != 0)) ||
                       ((iVar5 = unz64local_getLong(&local_180,pvVar9,&local_1b0), iVar5 != 0 ||
                        ((local_1b0 != 0 ||
                         (iVar5 = unz64local_getLong64(&local_180,pvVar9,&local_1a8), iVar5 != 0))))
                       )) || (iVar5 = unz64local_getLong(&local_180,pvVar9,&local_1b0),
                             local_1c8 = local_1a8, iVar5 != 0)) ||
                     ((((local_1b0 != 1 ||
                        (lVar14 = call_zseek64(&local_180,pvVar9,local_1a8,0), lVar14 != 0)) ||
                       (iVar5 = unz64local_getLong(&local_180,pvVar9,&local_1b0), iVar5 != 0)) ||
                      ((local_1b0 != 0x6064b50 || (local_1c8 == 0)))))) goto LAB_001a843f;
                  local_34 = 1;
                  lVar14 = call_zseek64(&local_180,local_120,local_1c8,0);
                  iVar5 = unz64local_getLong(&local_180,local_120,&local_1b0);
                  iVar17 = unz64local_getLong64(&local_180,local_120,&local_190);
                  iVar6 = unz64local_getShort(&local_180,local_120,&local_188);
                  iVar7 = unz64local_getShort(&local_180,local_120,&local_188);
                  iVar8 = unz64local_getLong(&local_180,local_120,&local_1a8);
                  iVar2 = unz64local_getLong(&local_180,local_120,&local_1a0);
                  iVar3 = unz64local_getLong64(&local_180,local_120,local_118);
                  iVar4 = unz64local_getLong64(&local_180,local_120,&local_198);
                  uVar18 = 0xffffff99;
                  if ((local_198 == local_118[0] && local_1a0 == 0) && local_1a8 == 0) {
                    uVar18 = -(uint)((((iVar7 != 0 || iVar6 != 0) ||
                                      ((iVar4 != 0 || iVar3 != 0) || (iVar2 != 0 || iVar8 != 0))) ||
                                     (iVar17 != 0 || iVar5 != 0)) || lVar14 != 0);
                  }
                  iVar5 = unz64local_getLong64(&local_180,local_120,&local_e0);
                  iVar17 = unz64local_getLong64(&local_180,local_120,local_d8);
                  uVar21 = 0xffffffff;
                  if (iVar17 == 0 && iVar5 == 0) {
                    uVar21 = uVar18;
                  }
                  local_118[1] = 0;
                  goto LAB_001a86cb;
                }
                break;
              }
              uVar23 = uVar23 - 1;
              iVar17 = iVar5 + -1;
              bVar1 = 0 < iVar5;
              iVar5 = iVar17;
            } while (iVar17 != 0 && bVar1);
          } while (uVar16 < uVar11);
        }
        free(pvVar12);
      }
    }
LAB_001a843f:
    pvVar9 = local_120;
    lVar14 = call_zseek64(&local_180,local_120,0,2);
    local_1c8 = 0;
    uVar18 = 0xffffffff;
    if (lVar14 == 0) {
      ZVar10 = call_ztell64(&local_180,pvVar9);
      uVar11 = 0xffff;
      if (ZVar10 < 0xffff) {
        uVar11 = ZVar10;
      }
      pvVar12 = malloc(0x404);
      if (pvVar12 == (void *)0x0) {
        local_1c8 = 0;
        uVar18 = 0xffffffff;
      }
      else {
        uVar18 = 0xffffffff;
        if (ZVar10 < 5) {
          local_1c8 = 0;
        }
        else {
          uVar22 = 4;
          do {
            uVar16 = uVar22 + 0x400;
            uVar22 = uVar11;
            if (uVar16 < uVar11) {
              uVar22 = uVar16;
            }
            uVar19 = 0x404;
            if (uVar22 < 0x404) {
              uVar19 = uVar22;
            }
            lVar14 = call_zseek64(&local_180,pvVar9,ZVar10 - uVar22,0);
            if ((lVar14 != 0) ||
               (uVar13 = (*local_180.zfile_func64.zread_file)
                                   (local_180.zfile_func64.opaque,pvVar9,pvVar12,uVar19),
               uVar13 != uVar19)) break;
            uVar23 = (ulong)((int)uVar19 - 4);
            lVar14 = (uVar22 - ZVar10) - uVar23;
            pcVar15 = (char *)((long)pvVar12 + uVar23 + 3);
            iVar5 = (int)uVar19 + -3;
            do {
              if ((((pcVar15[-3] == 'P') && (pcVar15[-2] == 'K')) && (pcVar15[-1] == '\x05')) &&
                 (*pcVar15 == '\x06')) {
                if (lVar14 != 0) {
                  local_1c8 = -lVar14;
                  uVar18 = 0;
                  goto LAB_001a8594;
                }
                break;
              }
              lVar14 = lVar14 + 1;
              pcVar15 = pcVar15 + -1;
              iVar17 = iVar5 + -1;
              bVar1 = 0 < iVar5;
              iVar5 = iVar17;
            } while (iVar17 != 0 && bVar1);
          } while (uVar16 < uVar11);
          local_1c8 = 0;
          uVar18 = 0xffffffff;
        }
LAB_001a8594:
        free(pvVar12);
      }
    }
    local_34 = 0;
    lVar14 = call_zseek64(&local_180,local_120,local_1c8,0);
    iVar5 = unz64local_getLong(&local_180,local_120,&local_1b0);
    iVar17 = unz64local_getShort(&local_180,local_120,&local_1a8);
    iVar6 = unz64local_getShort(&local_180,local_120,&local_1a0);
    iVar7 = unz64local_getShort(&local_180,local_120,&local_1b0);
    local_118[0] = local_1b0;
    iVar8 = unz64local_getShort(&local_180,local_120,&local_1b0);
    uVar18 = -(uint)(lVar14 != 0) | uVar18;
    if ((iVar8 != 0 || iVar7 != 0) || (iVar6 != 0 || (iVar17 != 0 || iVar5 != 0))) {
      uVar18 = 0xffffffff;
    }
    uVar21 = 0xffffff99;
    if ((local_1b0 == local_118[0] && local_1a0 == 0) && local_1a8 == 0) {
      uVar21 = uVar18;
    }
    iVar5 = unz64local_getLong(&local_180,local_120,&local_1b0);
    local_e0 = local_1b0;
    iVar17 = unz64local_getLong(&local_180,local_120,&local_1b0);
    local_d8[0] = local_1b0;
    iVar6 = unz64local_getShort(&local_180,local_120,local_118 + 1);
    if (iVar6 != 0 || (iVar17 != 0 || iVar5 != 0)) {
      uVar21 = 0xffffffff;
    }
LAB_001a86cb:
    local_118[2] = local_1c8 - (local_e0 + local_d8[0]);
    if ((local_1c8 < local_e0 + local_d8[0]) || (uVar21 != 0)) {
      (*local_180.zfile_func64.zclose_file)(local_180.zfile_func64.opaque,local_120);
    }
    else {
      local_e8 = local_1c8;
      local_40 = 0;
      local_38 = 0;
      pvVar12 = malloc(0x150);
      if (pvVar12 != (void *)0x0) {
        memcpy(pvVar12,&local_180,0x150);
        *(undefined8 *)((long)pvVar12 + 0x88) = *(undefined8 *)((long)pvVar12 + 0xa8);
        *(undefined8 *)((long)pvVar12 + 0x80) = 0;
        iVar5 = unz64local_GetCurrentFileInfoInternal
                          (pvVar12,(unz_file_info64 *)((long)pvVar12 + 0xb0),
                           (unz_file_info64_internal *)((long)pvVar12 + 0x138),(char *)0x0,0,
                           (void *)0x0,0,(char *)0x0,0);
        *(ulong *)((long)pvVar12 + 0x90) = (ulong)(iVar5 == 0);
        return pvVar12;
      }
    }
  }
  return (unzFile)0x0;
}

Assistant:

local unzFile unzOpenInternal(const void* path,
    zlib_filefunc64_32_def* pzlib_filefunc64_32_def,
    int is64bitOpenFunction)
{
    unz64_s us;
    unz64_s* s;
    ZPOS64_T central_pos;
    uLong   uL;

    uLong number_disk;          /* number of the current dist, used for
                                   spaning ZIP, unsupported, always 0*/
    uLong number_disk_with_CD;  /* number the the disk with central dir, used
                                   for spaning ZIP, unsupported, always 0*/
    ZPOS64_T number_entry_CD;      /* total number of entries in
                                   the central dir
                                   (same than number_entry on nospan) */

    int err = UNZ_OK;

    if (unz_copyright[0] != ' ')
        return NULL;

    us.z_filefunc.zseek32_file = NULL;
    us.z_filefunc.ztell32_file = NULL;
    if (pzlib_filefunc64_32_def == NULL)
        fill_fopen64_filefunc(&us.z_filefunc.zfile_func64);
    else
        us.z_filefunc = *pzlib_filefunc64_32_def;
    us.is64bitOpenFunction = is64bitOpenFunction;



    us.filestream = ZOPEN64(us.z_filefunc,
        path,
        ZLIB_FILEFUNC_MODE_READ |
        ZLIB_FILEFUNC_MODE_EXISTING);
    if (us.filestream == NULL)
        return NULL;

    central_pos = unz64local_SearchCentralDir64(&us.z_filefunc, us.filestream);
    if (central_pos)
    {
        uLong uS;
        ZPOS64_T uL64;

        us.isZip64 = 1;

        if (ZSEEK64(us.z_filefunc, us.filestream,
            central_pos, ZLIB_FILEFUNC_SEEK_SET) != 0)
            err = UNZ_ERRNO;

        /* the signature, already checked */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;

        /* size of zip64 end of central directory record */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &uL64) != UNZ_OK)
            err = UNZ_ERRNO;

        /* version made by */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uS) != UNZ_OK)
            err = UNZ_ERRNO;

        /* version needed to extract */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uS) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of this disk */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &number_disk) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of the disk with the start of the central directory */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &number_disk_with_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central directory on this disk */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.gi.number_entry) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central directory */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &number_entry_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        if ((number_entry_CD != us.gi.number_entry) ||
            (number_disk_with_CD != 0) ||
            (number_disk != 0))
            err = UNZ_BADZIPFILE;

        /* size of the central directory */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.size_central_dir) != UNZ_OK)
            err = UNZ_ERRNO;

        /* offset of start of central directory with respect to the
          starting disk number */
        if (unz64local_getLong64(&us.z_filefunc, us.filestream, &us.offset_central_dir) != UNZ_OK)
            err = UNZ_ERRNO;

        us.gi.size_comment = 0;
    }
    else
    {
        central_pos = unz64local_SearchCentralDir(&us.z_filefunc, us.filestream);
        if (central_pos == 0)
            err = UNZ_ERRNO;

        us.isZip64 = 0;

        if (ZSEEK64(us.z_filefunc, us.filestream,
            central_pos, ZLIB_FILEFUNC_SEEK_SET) != 0)
            err = UNZ_ERRNO;

        /* the signature, already checked */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of this disk */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &number_disk) != UNZ_OK)
            err = UNZ_ERRNO;

        /* number of the disk with the start of the central directory */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &number_disk_with_CD) != UNZ_OK)
            err = UNZ_ERRNO;

        /* total number of entries in the central dir on this disk */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.gi.number_entry = uL;

        /* total number of entries in the central dir */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        number_entry_CD = uL;

        if ((number_entry_CD != us.gi.number_entry) ||
            (number_disk_with_CD != 0) ||
            (number_disk != 0))
            err = UNZ_BADZIPFILE;

        /* size of the central directory */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.size_central_dir = uL;

        /* offset of start of central directory with respect to the
            starting disk number */
        if (unz64local_getLong(&us.z_filefunc, us.filestream, &uL) != UNZ_OK)
            err = UNZ_ERRNO;
        us.offset_central_dir = uL;

        /* zipfile comment length */
        if (unz64local_getShort(&us.z_filefunc, us.filestream, &us.gi.size_comment) != UNZ_OK)
            err = UNZ_ERRNO;
    }

    if ((central_pos < us.offset_central_dir + us.size_central_dir) &&
        (err == UNZ_OK))
        err = UNZ_BADZIPFILE;

    if (err != UNZ_OK)
    {
        ZCLOSE64(us.z_filefunc, us.filestream);
        return NULL;
    }

    us.byte_before_the_zipfile = central_pos -
        (us.offset_central_dir + us.size_central_dir);
    us.central_pos = central_pos;
    us.pfile_in_zip_read = NULL;
    us.encrypted = 0;


    s = (unz64_s*)ALLOC(sizeof(unz64_s));
    if (s != NULL)
    {
        *s = us;
        unzGoToFirstFile((unzFile)s);
    }
    return (unzFile)s;
}